

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

ProgramContext * __thiscall
deqp::gles3::Performance::ShaderCompilerLoopCase::generateShaderData
          (ProgramContext *__return_storage_ptr__,ShaderCompilerLoopCase *this,int measurementNdx)

{
  deUint32 id;
  int in_R9D;
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  local_108;
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  local_f0;
  string local_d8;
  string local_b8;
  string local_88;
  string local_68;
  undefined1 local_41;
  undefined1 local_40 [8];
  string nameSpec;
  deUint32 specID;
  int measurementNdx_local;
  ShaderCompilerLoopCase *this_local;
  ProgramContext *result;
  
  nameSpec.field_2._12_4_ = measurementNdx;
  nameSpec.field_2._8_4_ =
       ShaderCompilerCase::getSpecializationID(&this->super_ShaderCompilerCase,measurementNdx);
  getNameSpecialization_abi_cxx11_
            ((string *)local_40,(Performance *)(ulong)(uint)nameSpec.field_2._8_4_,id);
  local_41 = 0;
  ShaderCompilerCase::ProgramContext::ProgramContext(__return_storage_ptr__);
  loopVertexTemplate_abi_cxx11_
            (&local_88,(Performance *)(ulong)this->m_type,this->m_isVertexCase & LOOP_TYPE_UNIFORM,
             SUB41(this->m_numLoopIterations,0),this->m_nestingDepth,in_R9D);
  specializeShaderSource(&local_68,&local_88,nameSpec.field_2._8_4_,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  loopFragmentTemplate_abi_cxx11_
            (&local_d8,(Performance *)(ulong)this->m_type,this->m_isVertexCase & LOOP_TYPE_UNIFORM,
             SUB41(this->m_numLoopIterations,0),this->m_nestingDepth,in_R9D);
  specializeShaderSource(&local_b8,&local_d8,nameSpec.field_2._8_4_,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  loopShaderAttributes(&local_f0,(string *)local_40,this->m_type,this->m_numLoopIterations);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::operator=(&__return_storage_ptr__->vertexAttributes,&local_f0);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector(&local_f0);
  loopShaderUniforms(&local_108,(string *)local_40,this->m_type,this->m_numLoopIterations);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::operator=(&__return_storage_ptr__->uniforms,&local_108);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector(&local_108);
  local_41 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

ShaderCompilerCase::ProgramContext ShaderCompilerLoopCase::generateShaderData (int measurementNdx) const
{
	deUint32		specID		= getSpecializationID(measurementNdx);
	string			nameSpec	= getNameSpecialization(specID);
	ProgramContext	result;

	result.vertShaderSource		= specializeShaderSource(loopVertexTemplate(m_type, m_isVertexCase, m_numLoopIterations, m_nestingDepth), specID, SHADER_VALIDITY_VALID);
	result.fragShaderSource		= specializeShaderSource(loopFragmentTemplate(m_type, m_isVertexCase, m_numLoopIterations, m_nestingDepth), specID, SHADER_VALIDITY_VALID);

	result.vertexAttributes		= loopShaderAttributes(nameSpec, m_type, m_numLoopIterations);
	result.uniforms				= loopShaderUniforms(nameSpec, m_type, m_numLoopIterations);

	return result;
}